

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  secp256k1_modinv64_modinfo *psVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  secp256k1_gej *psVar13;
  long lVar14;
  ulong uVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *a_00;
  uint64_t *puVar18;
  ulong uVar19;
  uint64_t *puVar20;
  long lVar21;
  long lVar22;
  undefined1 *puVar23;
  secp256k1_gej *unaff_R12;
  secp256k1_fe *unaff_R13;
  ulong uVar24;
  secp256k1_gej *psVar25;
  secp256k1_modinv64_modinfo *psVar26;
  secp256k1_modinv64_modinfo *psVar27;
  secp256k1_fe *modinfo;
  bool bVar28;
  undefined1 auVar29 [16];
  secp256k1_fe s;
  secp256k1_fe l;
  secp256k1_strauss_state sStack_bf8;
  secp256k1_gej sStack_be0;
  secp256k1_fe asStack_b48 [8];
  secp256k1_ge asStack_9c8 [8];
  secp256k1_strauss_point_state sStack_688;
  ulong uStack_278;
  secp256k1_gej *psStack_270;
  secp256k1_modinv64_modinfo *psStack_268;
  secp256k1_gej *psStack_258;
  secp256k1_modinv64_modinfo *psStack_250;
  ulong uStack_248;
  secp256k1_gej *psStack_240;
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  secp256k1_modinv64_modinfo *psStack_220;
  ulong uStack_218;
  secp256k1_modinv64_modinfo *psStack_210;
  ulong uStack_208;
  undefined1 auStack_200 [48];
  secp256k1_modinv64_modinfo *psStack_1d0;
  ulong uStack_1c8;
  ulong uStack_1c0;
  secp256k1_gej *psStack_1b8;
  undefined1 auStack_1b0 [56];
  ulong uStack_178;
  ulong uStack_170;
  secp256k1_gej *psStack_168;
  undefined1 auStack_160 [96];
  secp256k1_gej *psStack_100;
  undefined1 *puStack_f8;
  secp256k1_gej *psStack_f0;
  secp256k1_modinv64_modinfo *psStack_e8;
  code *pcStack_e0;
  secp256k1_gej *psStack_d8;
  secp256k1_gej *psStack_c8;
  secp256k1_fe local_b8;
  undefined1 local_88 [56];
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  int local_30;
  int local_2c;
  
  psVar16 = (secp256k1_gej *)&local_b8;
  psVar17 = (secp256k1_gej *)&local_b8;
  modinfo = &local_b8;
  secp256k1_gej_verify(a);
  r->infinity = a->infinity;
  secp256k1_fe_mul(&r->z,&a->z,&a->y);
  secp256k1_fe_sqr(&local_b8,&a->y);
  psVar25 = (secp256k1_gej *)(local_88 + 0x30);
  psVar13 = a;
  secp256k1_fe_sqr((secp256k1_fe *)psVar25,&a->x);
  secp256k1_fe_verify((secp256k1_fe *)psVar25);
  if (local_30 < 0xb) {
    local_30 = local_30 * 3;
    psVar13 = (secp256k1_gej *)(local_88 + 0x30);
    local_88._48_8_ = local_88._48_8_ * 3;
    local_50 = local_50 * 3;
    local_48 = local_48 * 3;
    local_40 = local_40 * 3;
    local_38 = local_38 * 3;
    local_2c = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar13);
    secp256k1_fe_half((secp256k1_fe *)psVar13);
    secp256k1_fe_verify(&local_b8);
    secp256k1_fe_verify_magnitude(&local_b8,1);
    local_88._0_8_ = 0x3ffffbfffff0bc - local_b8.n[0];
    local_88._8_8_ = 0x3ffffffffffffc - local_b8.n[1];
    unaff_R12 = (secp256k1_gej *)local_88;
    local_88._16_8_ = 0x3ffffffffffffc - local_b8.n[2];
    local_88._24_8_ = 0x3ffffffffffffc - local_b8.n[3];
    local_88._32_8_ = 0x3fffffffffffc - local_b8.n[4];
    local_88._40_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    secp256k1_fe_mul((secp256k1_fe *)unaff_R12,(secp256k1_fe *)unaff_R12,&a->x);
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar13);
    secp256k1_fe_verify(&r->x);
    psVar25 = unaff_R12;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    iVar4 = local_88._40_4_ + (r->x).magnitude;
    unaff_R13 = &local_b8;
    if (0x20 < iVar4) goto LAB_0014bdad;
    uVar1 = (r->x).n[1];
    uVar2 = (r->x).n[2];
    uVar3 = (r->x).n[3];
    a = (secp256k1_gej *)local_88;
    (r->x).n[0] = (r->x).n[0] + local_88._0_8_;
    (r->x).n[1] = uVar1 + local_88._8_8_;
    (r->x).n[2] = uVar2 + local_88._16_8_;
    (r->x).n[3] = uVar3 + local_88._24_8_;
    puVar18 = (r->x).n + 4;
    *puVar18 = *puVar18 + local_88._32_8_;
    (r->x).magnitude = iVar4;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify(&r->x);
    psVar25 = a;
    secp256k1_fe_verify((secp256k1_fe *)a);
    iVar4 = local_88._40_4_ + (r->x).magnitude;
    unaff_R13 = &local_b8;
    if (0x20 < iVar4) goto LAB_0014bdb2;
    uVar1 = (r->x).n[1];
    uVar2 = (r->x).n[2];
    uVar3 = (r->x).n[3];
    a = (secp256k1_gej *)local_88;
    (r->x).n[0] = (r->x).n[0] + local_88._0_8_;
    (r->x).n[1] = uVar1 + local_88._8_8_;
    (r->x).n[2] = uVar2 + local_88._16_8_;
    (r->x).n[3] = uVar3 + local_88._24_8_;
    puVar18 = (r->x).n + 4;
    *puVar18 = *puVar18 + local_88._32_8_;
    (r->x).magnitude = iVar4;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_sqr(&local_b8,&local_b8);
    secp256k1_fe_verify((secp256k1_fe *)a);
    psVar25 = r;
    secp256k1_fe_verify(&r->x);
    uVar5 = (r->x).magnitude + local_88._40_4_;
    unaff_R13 = &local_b8;
    if (0x20 < (int)uVar5) goto LAB_0014bdb7;
    psVar16 = (secp256k1_gej *)local_88;
    local_88._0_8_ = (r->x).n[0] + local_88._0_8_;
    local_88._8_8_ = (r->x).n[1] + local_88._8_8_;
    local_88._16_8_ = (r->x).n[2] + local_88._16_8_;
    local_88._24_8_ = (r->x).n[3] + local_88._24_8_;
    local_88._32_8_ = local_88._32_8_ + (r->x).n[4];
    local_88._44_4_ = 0;
    local_88._40_4_ = uVar5;
    secp256k1_fe_verify((secp256k1_fe *)psVar16);
    a = (secp256k1_gej *)&r->y;
    secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)psVar16,(secp256k1_fe *)(local_88 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)a);
    secp256k1_fe_verify(&local_b8);
    local_b8.magnitude = local_b8.magnitude + (r->y).magnitude;
    unaff_R13 = &local_b8;
    if (local_b8.magnitude < 0x21) {
      uVar1 = (r->y).n[1];
      uVar2 = (r->y).n[2];
      uVar3 = (r->y).n[3];
      (r->y).n[0] = (r->y).n[0] + local_b8.n[0];
      (r->y).n[1] = uVar1 + local_b8.n[1];
      (r->y).n[2] = uVar2 + local_b8.n[2];
      (r->y).n[3] = uVar3 + local_b8.n[3];
      puVar18 = (r->y).n + 4;
      *puVar18 = *puVar18 + local_b8.n[4];
      (r->y).magnitude = local_b8.magnitude;
      (r->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)a);
      secp256k1_fe_verify((secp256k1_fe *)a);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)a,2);
      uVar1 = (r->y).n[1];
      uVar2 = (r->y).n[2];
      uVar3 = (r->y).n[3];
      (r->y).n[0] = 0x5ffff9ffffe91a - (r->y).n[0];
      (r->y).n[1] = 0x5ffffffffffffa - uVar1;
      (r->y).n[2] = 0x5ffffffffffffa - uVar2;
      (r->y).n[3] = 0x5ffffffffffffa - uVar3;
      (r->y).n[4] = 0x5fffffffffffa - (r->y).n[4];
      (r->y).magnitude = 3;
      (r->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)a);
      secp256k1_gej_verify(r);
      return;
    }
  }
  else {
    secp256k1_gej_double_cold_5();
LAB_0014bdad:
    secp256k1_gej_double_cold_4();
LAB_0014bdb2:
    psVar16 = psVar13;
    secp256k1_gej_double_cold_3();
LAB_0014bdb7:
    psVar17 = psVar25;
    modinfo = (secp256k1_fe *)(local_88 + 0x30);
    secp256k1_gej_double_cold_2();
  }
  secp256k1_gej_double_cold_1();
  uVar7 = (ulong)psVar16 & 0xffffffff;
  psStack_d8 = (secp256k1_gej *)0x14bdce;
  psVar25 = psVar17;
  psStack_c8 = r;
  secp256k1_fe_verify(&psVar17->x);
  if ((uint)psVar16 < 0x21) {
    iVar4 = (psVar17->x).magnitude * (uint)psVar16;
    if (iVar4 < 0x21) {
      (psVar17->x).n[0] = (psVar17->x).n[0] * uVar7;
      (psVar17->x).n[1] = (psVar17->x).n[1] * uVar7;
      (psVar17->x).n[2] = (psVar17->x).n[2] * uVar7;
      (psVar17->x).n[3] = (psVar17->x).n[3] * uVar7;
      (psVar17->x).n[4] = uVar7 * (psVar17->x).n[4];
      (psVar17->x).magnitude = iVar4;
      (psVar17->x).normalized = 0;
      secp256k1_fe_verify(&psVar17->x);
      return;
    }
  }
  else {
    psStack_d8 = (secp256k1_gej *)0x14be34;
    secp256k1_fe_mul_int_unchecked_cold_2();
  }
  psStack_d8 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  pcStack_e0 = (code *)0x14be42;
  psStack_d8 = psVar17;
  secp256k1_fe_verify(&psVar25->x);
  pcStack_e0 = (code *)0x14be4f;
  psVar13 = psVar25;
  secp256k1_fe_verify_magnitude(&psVar25->x,0x1f);
  psVar8 = (secp256k1_modinv64_modinfo *)(psVar25->x).n[0];
  uVar6 = -(ulong)((uint)psVar8 & 1);
  uVar9 = uVar6 >> 0xc;
  uVar15 = (long)(psVar8->modulus).v + (uVar9 & 0xffffefffffc2f);
  if ((uVar15 & 1) == 0) {
    uVar7 = (uVar6 >> 0x10) + (psVar25->x).n[4];
    uVar10 = uVar9 + (psVar25->x).n[3];
    uVar5 = (uint)(uVar6 >> 0x2c);
    auVar29._0_8_ = CONCAT44(uVar5,(int)uVar9);
    auVar29._8_4_ = (int)uVar9;
    auVar29._12_4_ = uVar5;
    uVar6 = auVar29._0_8_ + (psVar25->x).n[1];
    uVar9 = auVar29._8_8_ + (psVar25->x).n[2];
    (psVar25->x).n[0] = ((ulong)((uint)uVar6 & 1) << 0x33) + (uVar15 >> 1);
    (psVar25->x).n[1] = ((uVar9 & 1) << 0x33) + (uVar6 >> 1);
    (psVar25->x).n[2] = ((uVar10 & 1) << 0x33) + (uVar9 >> 1);
    (psVar25->x).n[3] = ((ulong)((uint)uVar7 & 1) << 0x33) + (uVar10 >> 1);
    (psVar25->x).n[4] = uVar7 >> 1;
    (psVar25->x).magnitude = ((psVar25->x).magnitude >> 1) + 1;
    (psVar25->x).normalized = 0;
    secp256k1_fe_verify(&psVar25->x);
    return;
  }
  pcStack_e0 = secp256k1_modinv64;
  secp256k1_fe_half_cold_1();
  uVar10 = 0;
  auStack_160._16_8_ = 0;
  auStack_160._24_8_ = 0;
  auStack_160._0_8_ = 0;
  auStack_160._8_8_ = 0;
  auStack_160._32_8_ = 0;
  auStack_160._72_8_ = 0;
  auStack_160._80_8_ = 0;
  auStack_160._56_8_ = 0;
  auStack_160._64_8_ = 0;
  auStack_160._48_8_ = 1;
  uStack_248 = (psVar8->modulus).v[4];
  auStack_200._0_8_ = (psVar8->modulus).v[0];
  uStack_218 = (psVar8->modulus).v[1];
  uStack_230 = (psVar8->modulus).v[2];
  uVar6 = (psVar8->modulus).v[3];
  auStack_1b0._0_8_ = (psVar13->x).n[0];
  psStack_210 = (secp256k1_modinv64_modinfo *)(psVar13->x).n[1];
  psStack_220 = (secp256k1_modinv64_modinfo *)(psVar13->x).n[2];
  uStack_238 = (psVar13->x).n[3];
  auStack_1b0._32_8_ = (psVar13->x).n[4];
  uVar15 = 0xffffffffffffffff;
  psVar26 = (secp256k1_modinv64_modinfo *)auStack_1b0._0_8_;
  uVar9 = auStack_200._0_8_;
  psStack_250 = psVar8;
  psStack_240 = (secp256k1_gej *)auStack_1b0._32_8_;
  auStack_200._8_8_ = uStack_218;
  auStack_200._16_8_ = uStack_230;
  auStack_200._24_8_ = uVar6;
  auStack_200._32_8_ = uStack_248;
  auStack_200._40_8_ = psVar13;
  auStack_1b0._8_8_ = psStack_210;
  auStack_1b0._16_8_ = psStack_220;
  auStack_1b0._24_8_ = uStack_238;
  auStack_160._88_8_ = psVar25;
  psStack_100 = unaff_R12;
  puStack_f8 = (undefined1 *)unaff_R13;
  psStack_f0 = a;
  psStack_e8 = (secp256k1_modinv64_modinfo *)modinfo;
  pcStack_e0 = (code *)uVar7;
  do {
    psVar25 = (secp256k1_gej *)0x8;
    lVar11 = 3;
    uVar7 = 0;
    uVar24 = 0;
    psVar16 = (secp256k1_gej *)0x8;
    psStack_258 = (secp256k1_gej *)0x8;
    psVar8 = psVar26;
    uVar12 = uVar9;
    psVar17 = psVar13;
    psVar27 = (secp256k1_modinv64_modinfo *)modinfo;
    do {
      uStack_208 = uVar6;
      if ((uVar12 & 1) == 0) {
        psStack_268 = (secp256k1_modinv64_modinfo *)0x14c974;
        secp256k1_modinv64_cold_29();
LAB_0014c974:
        psStack_268 = (secp256k1_modinv64_modinfo *)0x14c979;
        secp256k1_modinv64_cold_1();
LAB_0014c979:
        psStack_268 = (secp256k1_modinv64_modinfo *)0x14c97e;
        secp256k1_modinv64_cold_2();
LAB_0014c97e:
        psStack_268 = (secp256k1_modinv64_modinfo *)0x14c983;
        secp256k1_modinv64_cold_28();
        goto LAB_0014c983;
      }
      psVar17 = (secp256k1_gej *)(uVar7 * (long)psVar26 + (long)psVar25 * uVar9);
      psVar16 = (secp256k1_gej *)(uVar12 << ((byte)lVar11 & 0x3f));
      if (psVar17 != psVar16) goto LAB_0014c974;
      psVar17 = (secp256k1_gej *)((long)psStack_258 * (long)psVar26 + uVar24 * uVar9);
      psVar16 = (secp256k1_gej *)((long)psVar8 << ((byte)lVar11 & 0x3f));
      if (psVar17 != psVar16) goto LAB_0014c979;
      psVar16 = (secp256k1_gej *)((long)uVar15 >> 0x3f);
      uStack_1c0 = (ulong)((uint)psVar8 & 1);
      uVar19 = -uStack_1c0;
      psVar17 = (secp256k1_gej *)((ulong)psVar16 & uVar19);
      uVar15 = uVar15 ^ (ulong)psVar17;
      psVar27 = psVar26;
      psStack_1b8 = psVar16;
      if (uVar15 - 0x251 < 0xfffffffffffffb61) goto LAB_0014c97e;
      uVar15 = uVar15 - 1;
      psVar13 = (secp256k1_gej *)
                ((long)(psStack_258->x).n + (((ulong)psVar16 ^ uVar7) - (long)psVar16 & uVar19));
      uVar7 = (uVar7 + ((ulong)psVar13 & (ulong)psVar17)) * 2;
      uVar24 = uVar24 + (((ulong)psVar16 ^ (ulong)psVar25) - (long)psVar16 & uVar19);
      psVar25 = (secp256k1_gej *)(((long)(psVar25->x).n + (uVar24 & (ulong)psVar17)) * 2);
      puVar23 = (undefined1 *)
                ((long)(psVar8->modulus).v + (((ulong)psVar16 ^ uVar12) - (long)psVar16 & uVar19));
      psVar8 = (secp256k1_modinv64_modinfo *)((ulong)puVar23 >> 1);
      uVar12 = uVar12 + ((ulong)puVar23 & (ulong)psVar17);
      lVar11 = lVar11 + 1;
      psStack_258 = psVar13;
    } while (lVar11 != 0x3e);
    psVar16 = (secp256k1_gej *)(uVar7 * uVar24);
    modinfo = (secp256k1_fe *)psVar26;
    uStack_228 = uVar9;
    uStack_1c8 = uVar10;
    auStack_1b0._48_8_ = psVar25;
    uStack_178 = uVar7;
    uStack_170 = uVar24;
    psStack_168 = psVar13;
    if ((SUB168(SEXT816((long)psVar25) * SEXT816((long)psVar13),8) -
        SUB168(SEXT816((long)uVar7) * SEXT816((long)uVar24),8)) -
        (ulong)((secp256k1_gej *)((long)psVar25 * (long)psVar13) < psVar16) != 2 ||
        (long)psVar25 * (long)psVar13 - (long)psVar16 != 0) goto LAB_0014c9fb;
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c189;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_160,
               (secp256k1_modinv64_signed62 *)(auStack_160 + 0x30),
               (secp256k1_modinv64_trans2x2 *)(auStack_1b0 + 0x30),psStack_250);
    a_00 = (secp256k1_gej *)auStack_200;
    psVar16 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c1a7;
    psVar17 = a_00;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&psStack_250->modulus,-1);
    if (iVar4 < 1) {
LAB_0014c983:
      a_00 = psVar17;
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c988;
      secp256k1_modinv64_cold_27();
LAB_0014c988:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c98d;
      secp256k1_modinv64_cold_26();
LAB_0014c98d:
      psVar13 = a_00;
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c992;
      secp256k1_modinv64_cold_25();
LAB_0014c992:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c997;
      secp256k1_modinv64_cold_24();
LAB_0014c997:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c99c;
      secp256k1_modinv64_cold_4();
LAB_0014c99c:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9a1;
      secp256k1_modinv64_cold_5();
      psVar26 = psVar27;
LAB_0014c9a1:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9a6;
      secp256k1_modinv64_cold_21();
LAB_0014c9a6:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9ab;
      secp256k1_modinv64_cold_20();
LAB_0014c9ab:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9b0;
      secp256k1_modinv64_cold_19();
LAB_0014c9b0:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9b5;
      secp256k1_modinv64_cold_18();
LAB_0014c9b5:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9ba;
      secp256k1_modinv64_cold_17();
LAB_0014c9ba:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9bf;
      secp256k1_modinv64_cold_16();
LAB_0014c9bf:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9c4;
      secp256k1_modinv64_cold_15();
      modinfo = (secp256k1_fe *)psVar26;
LAB_0014c9c4:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9c9;
      secp256k1_modinv64_cold_14();
LAB_0014c9c9:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9ce;
      secp256k1_modinv64_cold_13();
LAB_0014c9ce:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9d3;
      secp256k1_modinv64_cold_12();
LAB_0014c9d3:
      psVar17 = psVar13;
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9d8;
      secp256k1_modinv64_cold_11();
LAB_0014c9d8:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9dd;
      secp256k1_modinv64_cold_10();
LAB_0014c9dd:
      psVar13 = psVar17;
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9e2;
      secp256k1_modinv64_cold_9();
LAB_0014c9e2:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9e7;
      secp256k1_modinv64_cold_8();
      psVar26 = (secp256k1_modinv64_modinfo *)modinfo;
LAB_0014c9e7:
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9ec;
      secp256k1_modinv64_cold_23();
LAB_0014c9ec:
      modinfo = (secp256k1_fe *)psVar26;
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9f1;
      secp256k1_modinv64_cold_22();
      goto LAB_0014c9f1;
    }
    psVar16 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c1c6;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&psStack_250->modulus,1);
    if (0 < iVar4) goto LAB_0014c988;
    psVar13 = (secp256k1_gej *)auStack_1b0;
    psVar16 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c1ef;
    a_00 = psVar13;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar13,5,&psStack_250->modulus,-1);
    if (iVar4 < 1) goto LAB_0014c98d;
    psVar16 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c20e;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar13,5,&psStack_250->modulus,1);
    modinfo = (secp256k1_fe *)psStack_250;
    if (-1 < iVar4) goto LAB_0014c992;
    psVar16 = (secp256k1_gej *)((long)psVar25 * uStack_228);
    lVar11 = SUB168(SEXT816((long)psVar25) * SEXT816((long)uStack_228),8);
    uVar6 = uVar7 * (long)psVar26;
    psVar13 = SUB168(SEXT816((long)uVar7) * SEXT816((long)psVar26),8);
    if ((-1 < (long)psVar13) &&
       (uVar9 = (ulong)((secp256k1_gej *)(-1 - uVar6) < psVar16),
       lVar14 = (0x7fffffffffffffff - (long)psVar13) - lVar11,
       (SBORROW8(0x7fffffffffffffff - (long)psVar13,lVar11) != SBORROW8(lVar14,uVar9)) !=
       (long)(lVar14 - uVar9) < 0)) goto LAB_0014c9e7;
    puVar18 = (uint64_t *)((long)(psVar16->x).n + uVar6);
    psVar13 = (secp256k1_gej *)((long)(psVar13->x).n + (ulong)CARRY8(uVar6,(ulong)psVar16) + lVar11)
    ;
    uVar6 = uVar24 * uStack_228;
    lVar11 = SUB168(SEXT816((long)uVar24) * SEXT816((long)uStack_228),8);
    psVar16 = (secp256k1_gej *)((long)psStack_258 * (long)psVar26);
    lVar14 = SUB168(SEXT816((long)psStack_258) * SEXT816((long)psVar26),8);
    if ((-1 < lVar14) &&
       (uVar9 = (ulong)(-(long)psVar16 - 1U < uVar6),
       lVar22 = (0x7fffffffffffffff - lVar14) - lVar11,
       (SBORROW8(0x7fffffffffffffff - lVar14,lVar11) != SBORROW8(lVar22,uVar9)) !=
       (long)(lVar22 - uVar9) < 0)) goto LAB_0014c9ec;
    bVar28 = CARRY8((ulong)psVar16,uVar6);
    psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + uVar6);
    lVar11 = lVar14 + lVar11 + (ulong)bVar28;
    if (((ulong)puVar18 & 0x3ffffffffffffffe) != 0) goto LAB_0014c997;
    if (((ulong)psVar16 & 0x3fffffffffffffff) != 0) goto LAB_0014c99c;
    uVar6 = (ulong)puVar18 >> 0x3e | (long)psVar13 * 4;
    uVar9 = uStack_218 * (long)psVar25 + uVar6;
    lVar14 = SUB168(SEXT816((long)uStack_218) * SEXT816((long)psVar25),8) + ((long)psVar13 >> 0x3e)
             + (ulong)CARRY8(uStack_218 * (long)psVar25,uVar6);
    uVar6 = (long)psStack_210 * uVar7;
    psVar13 = SUB168(SEXT816((long)psStack_210) * SEXT816((long)uVar7),8);
    if (-1 < (long)psVar13) {
      uVar10 = (ulong)(-uVar6 - 1 < uVar9);
      lVar22 = (0x7fffffffffffffff - (long)psVar13) - lVar14;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar13,lVar14) != SBORROW8(lVar22,uVar10)) ==
          (long)(lVar22 - uVar10) < 0) goto LAB_0014c346;
      goto LAB_0014c9a1;
    }
    lVar21 = (-0x8000000000000000 - (long)psVar13) - (ulong)(uVar6 != 0);
    lVar22 = lVar14 - lVar21;
    if ((SBORROW8(lVar14,lVar21) != SBORROW8(lVar22,(ulong)(uVar9 < -uVar6))) !=
        (long)(lVar22 - (ulong)(uVar9 < -uVar6)) < 0) goto LAB_0014c9a1;
LAB_0014c346:
    uVar10 = (ulong)psVar16 >> 0x3e | lVar11 * 4;
    psVar13 = (secp256k1_gej *)((long)(psVar13->x).n + (ulong)CARRY8(uVar6,uVar9) + lVar14);
    uVar12 = uStack_218 * uVar24 + uVar10;
    lVar11 = SUB168(SEXT816((long)uStack_218) * SEXT816((long)uVar24),8) + (lVar11 >> 0x3e) +
             (ulong)CARRY8(uStack_218 * uVar24,uVar10);
    uVar10 = (long)psStack_210 * (long)psStack_258;
    psVar16 = SUB168(SEXT816((long)psStack_210) * SEXT816((long)psStack_258),8);
    if (-1 < (long)psVar16) {
      uVar19 = (ulong)(-uVar10 - 1 < uVar12);
      lVar14 = (0x7fffffffffffffff - (long)psVar16) - lVar11;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar16,lVar11) != SBORROW8(lVar14,uVar19)) ==
          (long)(lVar14 - uVar19) < 0) goto LAB_0014c3c6;
      goto LAB_0014c9a6;
    }
    lVar22 = (-0x8000000000000000 - (long)psVar16) - (ulong)(uVar10 != 0);
    lVar14 = lVar11 - lVar22;
    if ((SBORROW8(lVar11,lVar22) != SBORROW8(lVar14,(ulong)(uVar12 < -uVar10))) !=
        (long)(lVar14 - (ulong)(uVar12 < -uVar10)) < 0) goto LAB_0014c9a6;
LAB_0014c3c6:
    psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + (ulong)CARRY8(uVar10,uVar12) + lVar11);
    uVar19 = (long)psVar13 * 4 | uVar6 + uVar9 >> 0x3e;
    uStack_228 = uVar6 + uVar9 & 0x3fffffffffffffff;
    psStack_1d0 = (secp256k1_modinv64_modinfo *)(uVar10 + uVar12 & 0x3fffffffffffffff);
    psVar17 = (secp256k1_gej *)(uStack_230 * (long)psVar25 + uVar19);
    lVar11 = SUB168(SEXT816((long)uStack_230) * SEXT816((long)psVar25),8) + ((long)psVar13 >> 0x3e)
             + (ulong)CARRY8(uStack_230 * (long)psVar25,uVar19);
    uVar6 = (long)psStack_220 * uVar7;
    lVar14 = SUB168(SEXT816((long)psStack_220) * SEXT816((long)uVar7),8);
    psVar26 = psStack_220;
    auStack_200._0_8_ = uStack_228;
    auStack_1b0._0_8_ = psStack_1d0;
    if (-1 < lVar14) {
      psVar13 = (secp256k1_gej *)(-1 - uVar6);
      lVar22 = (0x7fffffffffffffff - lVar14) - lVar11;
      if ((SBORROW8(0x7fffffffffffffff - lVar14,lVar11) !=
          SBORROW8(lVar22,(ulong)(psVar13 < psVar17))) ==
          (long)(lVar22 - (ulong)(psVar13 < psVar17)) < 0) goto LAB_0014c47c;
      goto LAB_0014c9ab;
    }
    lVar21 = (-0x8000000000000000 - lVar14) - (ulong)(uVar6 != 0);
    lVar22 = lVar11 - lVar21;
    psVar13 = (secp256k1_gej *)(lVar22 - (ulong)(psVar17 < (secp256k1_gej *)-uVar6));
    if ((SBORROW8(lVar11,lVar21) != SBORROW8(lVar22,(ulong)(psVar17 < (secp256k1_gej *)-uVar6))) !=
        (long)psVar13 < 0) goto LAB_0014c9ab;
LAB_0014c47c:
    uVar9 = uVar10 + uVar12 >> 0x3e | (long)psVar16 * 4;
    puVar18 = (uint64_t *)((long)(psVar17->x).n + uVar6);
    lVar11 = lVar11 + lVar14 + (ulong)CARRY8((ulong)psVar17,uVar6);
    psVar17 = (secp256k1_gej *)(uStack_230 * uVar24 + uVar9);
    psVar13 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_230) * SEXT816((long)uVar24),8) + ((long)psVar16 >> 0x3e)
              + (ulong)CARRY8(uStack_230 * uVar24,uVar9));
    uVar6 = (long)psStack_220 * (long)psStack_258;
    lVar14 = SUB168(SEXT816((long)psStack_220) * SEXT816((long)psStack_258),8);
    if (-1 < lVar14) {
      psVar16 = (secp256k1_gej *)(-1 - uVar6);
      lVar22 = (0x7fffffffffffffff - lVar14) - (long)psVar13;
      if ((SBORROW8(0x7fffffffffffffff - lVar14,(long)psVar13) !=
          SBORROW8(lVar22,(ulong)(psVar16 < psVar17))) ==
          (long)(lVar22 - (ulong)(psVar16 < psVar17)) < 0) goto LAB_0014c4eb;
      goto LAB_0014c9b0;
    }
    lVar21 = (-0x8000000000000000 - lVar14) - (ulong)(uVar6 != 0);
    lVar22 = (long)psVar13 - lVar21;
    psVar16 = (secp256k1_gej *)(lVar22 - (ulong)(psVar17 < (secp256k1_gej *)-uVar6));
    if ((SBORROW8((long)psVar13,lVar21) !=
        SBORROW8(lVar22,(ulong)(psVar17 < (secp256k1_gej *)-uVar6))) != (long)psVar16 < 0)
    goto LAB_0014c9b0;
LAB_0014c4eb:
    puVar20 = (uint64_t *)((long)(psVar17->x).n + uVar6);
    psVar13 = (secp256k1_gej *)((long)(psVar13->x).n + (ulong)CARRY8((ulong)psVar17,uVar6) + lVar14)
    ;
    uVar6 = lVar11 * 4 | (ulong)puVar18 >> 0x3e;
    auStack_200._8_8_ = (ulong)puVar18 & 0x3fffffffffffffff;
    psVar26 = (secp256k1_modinv64_modinfo *)((ulong)puVar20 & 0x3fffffffffffffff);
    uVar9 = uStack_208 * (long)psVar25 + uVar6;
    psVar16 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_208) * SEXT816((long)psVar25),8) + (lVar11 >> 0x3e) +
              (ulong)CARRY8(uStack_208 * (long)psVar25,uVar6));
    uVar6 = uStack_238 * uVar7;
    lVar11 = SUB168(SEXT816((long)uStack_238) * SEXT816((long)uVar7),8);
    auStack_1b0._8_8_ = psVar26;
    if (-1 < lVar11) {
      uVar10 = (ulong)(-uVar6 - 1 < uVar9);
      lVar14 = (0x7fffffffffffffff - lVar11) - (long)psVar16;
      if ((SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar16) != SBORROW8(lVar14,uVar10)) ==
          (long)(lVar14 - uVar10) < 0) goto LAB_0014c57d;
      goto LAB_0014c9b5;
    }
    lVar22 = (-0x8000000000000000 - lVar11) - (ulong)(uVar6 != 0);
    lVar14 = (long)psVar16 - lVar22;
    if ((SBORROW8((long)psVar16,lVar22) != SBORROW8(lVar14,(ulong)(uVar9 < -uVar6))) !=
        (long)(lVar14 - (ulong)(uVar9 < -uVar6)) < 0) goto LAB_0014c9b5;
LAB_0014c57d:
    uVar10 = (ulong)puVar20 >> 0x3e | (long)psVar13 * 4;
    psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + (ulong)CARRY8(uVar9,uVar6) + lVar11);
    psVar17 = (secp256k1_gej *)(uStack_208 * uVar24 + uVar10);
    lVar11 = SUB168(SEXT816((long)uStack_208) * SEXT816((long)uVar24),8) + ((long)psVar13 >> 0x3e) +
             (ulong)CARRY8(uStack_208 * uVar24,uVar10);
    uVar10 = uStack_238 * (long)psStack_258;
    lVar14 = SUB168(SEXT816((long)uStack_238) * SEXT816((long)psStack_258),8);
    if (-1 < lVar14) {
      psVar13 = (secp256k1_gej *)(-1 - uVar10);
      lVar22 = (0x7fffffffffffffff - lVar14) - lVar11;
      if ((SBORROW8(0x7fffffffffffffff - lVar14,lVar11) !=
          SBORROW8(lVar22,(ulong)(psVar13 < psVar17))) ==
          (long)(lVar22 - (ulong)(psVar13 < psVar17)) < 0) goto LAB_0014c5f5;
      goto LAB_0014c9ba;
    }
    lVar21 = (-0x8000000000000000 - lVar14) - (ulong)(uVar10 != 0);
    lVar22 = lVar11 - lVar21;
    psVar13 = (secp256k1_gej *)(lVar22 - (ulong)(psVar17 < (secp256k1_gej *)-uVar10));
    if ((SBORROW8(lVar11,lVar21) != SBORROW8(lVar22,(ulong)(psVar17 < (secp256k1_gej *)-uVar10))) !=
        (long)psVar13 < 0) goto LAB_0014c9ba;
LAB_0014c5f5:
    puVar18 = (uint64_t *)((long)(psVar17->x).n + uVar10);
    lVar11 = lVar11 + lVar14 + (ulong)CARRY8((ulong)psVar17,uVar10);
    uVar10 = (long)psVar16 * 4 | uVar9 + uVar6 >> 0x3e;
    auStack_200._16_8_ = uVar9 + uVar6 & 0x3fffffffffffffff;
    psStack_220 = (secp256k1_modinv64_modinfo *)((ulong)puVar18 & 0x3fffffffffffffff);
    auVar29 = SEXT816((long)psVar25);
    uVar6 = uStack_248 * (long)psVar25;
    psVar25 = (secp256k1_gej *)(uVar6 + uVar10);
    psVar13 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_248) * auVar29,8) + ((long)psVar16 >> 0x3e) +
              (ulong)CARRY8(uVar6,uVar10));
    uVar6 = (long)psStack_240 * uVar7;
    lVar14 = SUB168(SEXT816((long)psStack_240) * SEXT816((long)uVar7),8);
    if (lVar14 < 0) {
      lVar21 = (-0x8000000000000000 - lVar14) - (ulong)(uVar6 != 0);
      lVar22 = (long)psVar13 - lVar21;
      bVar28 = SBORROW8((long)psVar13,lVar21) !=
               SBORROW8(lVar22,(ulong)(psVar25 < (secp256k1_gej *)-uVar6));
      psVar16 = (secp256k1_gej *)(lVar22 - (ulong)(psVar25 < (secp256k1_gej *)-uVar6));
      psVar17 = psVar16;
    }
    else {
      psVar16 = (secp256k1_gej *)(-1 - uVar6);
      lVar22 = (0x7fffffffffffffff - lVar14) - (long)psVar13;
      bVar28 = SBORROW8(0x7fffffffffffffff - lVar14,(long)psVar13) !=
               SBORROW8(lVar22,(ulong)(psVar16 < psVar25));
      psVar17 = (secp256k1_gej *)(lVar22 - (ulong)(psVar16 < psVar25));
    }
    auStack_1b0._16_8_ = psStack_220;
    if (bVar28 != (long)psVar17 < 0) goto LAB_0014c9bf;
    uVar7 = (ulong)puVar18 >> 0x3e | lVar11 * 4;
    puVar18 = (uint64_t *)((long)(psVar25->x).n + uVar6);
    psVar13 = (secp256k1_gej *)((long)(psVar13->x).n + (ulong)CARRY8((ulong)psVar25,uVar6) + lVar14)
    ;
    psVar25 = (secp256k1_gej *)(uStack_248 * uVar24 + uVar7);
    psVar16 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_248) * SEXT816((long)uVar24),8) + (lVar11 >> 0x3e) +
              (ulong)CARRY8(uStack_248 * uVar24,uVar7));
    uVar7 = (long)psStack_240 * (long)psStack_258;
    lVar11 = SUB168(SEXT816((long)psStack_240) * SEXT816((long)psStack_258),8);
    psStack_210 = psVar26;
    if (-1 < lVar11) {
      uVar6 = (ulong)((secp256k1_gej *)(-1 - uVar7) < psVar25);
      lVar14 = (0x7fffffffffffffff - lVar11) - (long)psVar16;
      if ((SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar16) != SBORROW8(lVar14,uVar6)) ==
          (long)(lVar14 - uVar6) < 0) goto LAB_0014c73d;
      goto LAB_0014c9c4;
    }
    lVar22 = (-0x8000000000000000 - lVar11) - (ulong)(uVar7 != 0);
    lVar14 = (long)psVar16 - lVar22;
    if ((SBORROW8((long)psVar16,lVar22) !=
        SBORROW8(lVar14,(ulong)(psVar25 < (secp256k1_gej *)-uVar7))) !=
        (long)(lVar14 - (ulong)(psVar25 < (secp256k1_gej *)-uVar7)) < 0) goto LAB_0014c9c4;
LAB_0014c73d:
    psVar17 = (secp256k1_gej *)auStack_200;
    bVar28 = CARRY8((ulong)psVar25,uVar7);
    psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + uVar7);
    psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + (ulong)bVar28 + lVar11);
    uVar7 = (long)psVar13 * 4 | (ulong)puVar18 >> 0x3e;
    uVar6 = (ulong)puVar18 & 0x3fffffffffffffff;
    uStack_238 = (ulong)psVar25 & 0x3fffffffffffffff;
    psVar13 = (secp256k1_gej *)(((long)psVar13 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar7));
    uStack_230 = auStack_200._16_8_;
    uStack_218 = auStack_200._8_8_;
    auStack_200._24_8_ = uVar6;
    auStack_1b0._24_8_ = uStack_238;
    if (psVar13 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_0014c9c9;
    psVar25 = (secp256k1_gej *)((ulong)psVar25 >> 0x3e | (long)psVar16 * 4);
    psVar16 = (secp256k1_gej *)
              (((long)psVar16 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar25)
              );
    auStack_200._32_8_ = uVar7;
    if (psVar16 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_0014c9ce;
    psVar16 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c7d2;
    psVar13 = psVar17;
    uStack_248 = uVar7;
    auStack_1b0._32_8_ = psVar25;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&psStack_250->modulus,-1);
    if (iVar4 < 1) goto LAB_0014c9d3;
    psVar16 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c7ef;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,
                       (secp256k1_modinv64_signed62 *)modinfo,1);
    if (0 < iVar4) goto LAB_0014c9d8;
    psVar13 = (secp256k1_gej *)auStack_1b0;
    psVar16 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c816;
    psVar17 = psVar13;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar13,5,
                       (secp256k1_modinv64_signed62 *)modinfo,-1);
    if (iVar4 < 1) goto LAB_0014c9dd;
    psVar16 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c833;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar13,5,
                       (secp256k1_modinv64_signed62 *)modinfo,1);
    if (-1 < iVar4) goto LAB_0014c9e2;
    uVar5 = (int)uStack_1c8 + 1;
    uVar10 = (ulong)uVar5;
    psVar26 = psStack_1d0;
    uVar9 = uStack_228;
    psStack_240 = psVar25;
  } while (uVar5 != 10);
  psVar13 = (secp256k1_gej *)auStack_1b0;
  psVar16 = (secp256k1_gej *)0x5;
  psStack_268 = (secp256k1_modinv64_modinfo *)0x14c87d;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar13,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar4 != 0) {
LAB_0014c9f1:
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9f6;
    secp256k1_modinv64_cold_6();
LAB_0014c9f6:
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c9fb;
    secp256k1_modinv64_cold_7();
LAB_0014c9fb:
    psStack_268 = (secp256k1_modinv64_modinfo *)secp256k1_eckey_pubkey_tweak_add;
    secp256k1_modinv64_cold_3();
    uStack_278 = uVar15;
    psStack_270 = psVar25;
    psStack_268 = (secp256k1_modinv64_modinfo *)modinfo;
    secp256k1_gej_set_ge(&sStack_be0,(secp256k1_ge *)psVar13);
    sStack_bf8.aux = asStack_b48;
    sStack_bf8.pre_a = asStack_9c8;
    sStack_bf8.ps = &sStack_688;
    secp256k1_ecmult_strauss_wnaf
              (&sStack_bf8,&sStack_be0,1,&sStack_be0,&secp256k1_scalar_one,
               (secp256k1_scalar *)psVar16);
    secp256k1_gej_verify(&sStack_be0);
    if (sStack_be0.infinity == 0) {
      secp256k1_ge_set_gej((secp256k1_ge *)psVar13,&sStack_be0);
    }
    return;
  }
  psStack_268 = (secp256k1_modinv64_modinfo *)0x14c8a2;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)auStack_200,5,&SECP256K1_SIGNED62_ONE,-1);
  psVar25 = (secp256k1_gej *)auStack_200._40_8_;
  if (iVar4 != 0) {
    psStack_268 = (secp256k1_modinv64_modinfo *)0x14c8c9;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_200,5,&SECP256K1_SIGNED62_ONE,1);
    if (iVar4 != 0) {
      psVar16 = (secp256k1_gej *)0x5;
      psStack_268 = (secp256k1_modinv64_modinfo *)0x14c8e3;
      psVar13 = psVar25;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar25,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar4 == 0) {
        psVar13 = (secp256k1_gej *)auStack_160;
        psVar16 = (secp256k1_gej *)0x5;
        psStack_268 = (secp256k1_modinv64_modinfo *)0x14c906;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar13,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar4 == 0) {
          psVar13 = (secp256k1_gej *)auStack_200;
          psVar16 = (secp256k1_gej *)0x5;
          psStack_268 = (secp256k1_modinv64_modinfo *)0x14c925;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar13,5,
                             (secp256k1_modinv64_signed62 *)modinfo,1);
          if (iVar4 == 0) goto LAB_0014c92d;
        }
      }
      goto LAB_0014c9f6;
    }
  }
LAB_0014c92d:
  psStack_268 = (secp256k1_modinv64_modinfo *)0x14c945;
  secp256k1_modinv64_normalize_62
            ((secp256k1_modinv64_signed62 *)auStack_160,uStack_248,
             (secp256k1_modinv64_modinfo *)modinfo);
  (psVar25->x).n[4] = auStack_160._32_8_;
  (psVar25->x).n[2] = auStack_160._16_8_;
  (psVar25->x).n[3] = auStack_160._24_8_;
  (psVar25->x).n[0] = auStack_160._0_8_;
  (psVar25->x).n[1] = auStack_160._8_8_;
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 8 add/half/mul_int/negate */
    secp256k1_fe l, s, t;
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;

    /* Formula used:
     * L = (3/2) * X1^2
     * S = Y1^2
     * T = -X1*S
     * X3 = L^2 + 2*T
     * Y3 = -(L*(X3 + T) + S^2)
     * Z3 = Y1*Z1
     */

    secp256k1_fe_mul(&r->z, &a->z, &a->y); /* Z3 = Y1*Z1 (1) */
    secp256k1_fe_sqr(&s, &a->y);           /* S = Y1^2 (1) */
    secp256k1_fe_sqr(&l, &a->x);           /* L = X1^2 (1) */
    secp256k1_fe_mul_int(&l, 3);           /* L = 3*X1^2 (3) */
    secp256k1_fe_half(&l);                 /* L = 3/2*X1^2 (2) */
    secp256k1_fe_negate(&t, &s, 1);        /* T = -S (2) */
    secp256k1_fe_mul(&t, &t, &a->x);       /* T = -X1*S (1) */
    secp256k1_fe_sqr(&r->x, &l);           /* X3 = L^2 (1) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + T (2) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + 2*T (3) */
    secp256k1_fe_sqr(&s, &s);              /* S' = S^2 (1) */
    secp256k1_fe_add(&t, &r->x);           /* T' = X3 + T (4) */
    secp256k1_fe_mul(&r->y, &t, &l);       /* Y3 = L*(X3 + T) (1) */
    secp256k1_fe_add(&r->y, &s);           /* Y3 = L*(X3 + T) + S^2 (2) */
    secp256k1_fe_negate(&r->y, &r->y, 2);  /* Y3 = -(L*(X3 + T) + S^2) (3) */

    SECP256K1_GEJ_VERIFY(r);
}